

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_encoder.c
# Opt level: O0

aom_codec_cx_pkt_t * aom_codec_get_cx_data(aom_codec_ctx_t *ctx,aom_codec_iter_t *iter)

{
  aom_codec_get_cx_data_fn_t_conflict p_Var1;
  aom_codec_priv_t *paVar2;
  void *pvVar3;
  aom_codec_alg_priv_t_conflict *paVar4;
  aom_codec_cx_pkt_t *__dest;
  aom_codec_iter_t *in_RSI;
  aom_codec_ctx_t *in_RDI;
  aom_codec_cx_pkt_t *modified_pkt;
  char *dst_buf;
  aom_codec_priv_t *priv;
  aom_codec_cx_pkt_t *pkt;
  aom_codec_cx_pkt_t *local_18;
  
  local_18 = (aom_codec_cx_pkt_t *)0x0;
  if (in_RDI != (aom_codec_ctx_t *)0x0) {
    if (in_RSI == (aom_codec_iter_t *)0x0) {
      in_RDI->err = AOM_CODEC_INVALID_PARAM;
    }
    else if ((in_RDI->iface == (aom_codec_iface_t *)0x0) ||
            (in_RDI->priv == (aom_codec_priv_t *)0x0)) {
      in_RDI->err = AOM_CODEC_ERROR;
    }
    else if ((in_RDI->iface->caps & 2U) == 0) {
      in_RDI->err = AOM_CODEC_INCAPABLE;
    }
    else {
      p_Var1 = (in_RDI->iface->enc).get_cx_data;
      paVar4 = (aom_codec_alg_priv_t_conflict *)get_alg_priv(in_RDI);
      local_18 = (*p_Var1)(paVar4,in_RSI);
    }
  }
  if ((local_18 != (aom_codec_cx_pkt_t *)0x0) && (local_18->kind == AOM_CODEC_CX_FRAME_PKT)) {
    paVar2 = in_RDI->priv;
    pvVar3 = (paVar2->enc).cx_data_dst_buf.buf;
    if ((pvVar3 != (void *)0x0) &&
       (((local_18->data).frame.buf != pvVar3 &&
        ((local_18->data).frame.sz + (ulong)(paVar2->enc).cx_data_pad_before +
         (ulong)(paVar2->enc).cx_data_pad_after <= (paVar2->enc).cx_data_dst_buf.sz)))) {
      __dest = &(paVar2->enc).cx_data_pkt;
      memcpy((void *)((long)pvVar3 + (ulong)(paVar2->enc).cx_data_pad_before),
             (local_18->data).frame.buf,(local_18->data).frame.sz);
      memcpy(__dest,local_18,0xa8);
      (paVar2->enc).cx_data_pkt.data.frame.buf = pvVar3;
      (paVar2->enc).cx_data_pkt.data.frame.sz =
           (ulong)((paVar2->enc).cx_data_pad_before + (paVar2->enc).cx_data_pad_after) +
           (paVar2->enc).cx_data_pkt.data.frame.sz;
      local_18 = __dest;
    }
    if (pvVar3 == (local_18->data).frame.buf) {
      (paVar2->enc).cx_data_dst_buf.buf = (void *)((long)pvVar3 + (local_18->data).frame.sz);
      (paVar2->enc).cx_data_dst_buf.sz =
           (paVar2->enc).cx_data_dst_buf.sz - (local_18->data).frame.sz;
    }
  }
  return local_18;
}

Assistant:

const aom_codec_cx_pkt_t *aom_codec_get_cx_data(aom_codec_ctx_t *ctx,
                                                aom_codec_iter_t *iter) {
  const aom_codec_cx_pkt_t *pkt = NULL;

  if (ctx) {
    if (!iter)
      ctx->err = AOM_CODEC_INVALID_PARAM;
    else if (!ctx->iface || !ctx->priv)
      ctx->err = AOM_CODEC_ERROR;
    else if (!(ctx->iface->caps & AOM_CODEC_CAP_ENCODER))
      ctx->err = AOM_CODEC_INCAPABLE;
    else
      pkt = ctx->iface->enc.get_cx_data(get_alg_priv(ctx), iter);
  }

  if (pkt && pkt->kind == AOM_CODEC_CX_FRAME_PKT) {
    // If the application has specified a destination area for the
    // compressed data, and the codec has not placed the data there,
    // and it fits, copy it.
    aom_codec_priv_t *const priv = ctx->priv;
    char *const dst_buf = (char *)priv->enc.cx_data_dst_buf.buf;

    if (dst_buf && pkt->data.raw.buf != dst_buf &&
        pkt->data.raw.sz + priv->enc.cx_data_pad_before +
                priv->enc.cx_data_pad_after <=
            priv->enc.cx_data_dst_buf.sz) {
      aom_codec_cx_pkt_t *modified_pkt = &priv->enc.cx_data_pkt;

      memcpy(dst_buf + priv->enc.cx_data_pad_before, pkt->data.raw.buf,
             pkt->data.raw.sz);
      *modified_pkt = *pkt;
      modified_pkt->data.raw.buf = dst_buf;
      modified_pkt->data.raw.sz +=
          priv->enc.cx_data_pad_before + priv->enc.cx_data_pad_after;
      pkt = modified_pkt;
    }

    if (dst_buf == pkt->data.raw.buf) {
      priv->enc.cx_data_dst_buf.buf = dst_buf + pkt->data.raw.sz;
      priv->enc.cx_data_dst_buf.sz -= pkt->data.raw.sz;
    }
  }

  return pkt;
}